

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_decode_tiles
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  opj_tcd *poVar1;
  opj_tcd_tilecomp_t *poVar2;
  opj_image_comp_t *poVar3;
  opj_image_t *poVar4;
  OPJ_BOOL OVar5;
  OPJ_UINT32 OVar6;
  OPJ_BOOL OVar7;
  opj_image_t *poVar8;
  OPJ_OFF_T OVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  OPJ_UINT32 l_current_tile_no;
  OPJ_BOOL l_go_on;
  opj_stream_private_t *local_50;
  OPJ_UINT32 l_nb_comps;
  OPJ_INT32 l_tile_y1;
  OPJ_INT32 l_tile_x1;
  OPJ_INT32 l_tile_y0;
  OPJ_INT32 l_tile_x0;
  
  l_go_on = 1;
  OVar6 = (p_j2k->m_cp).tw;
  local_50 = p_stream;
  if (((((OVar6 == 1) && ((p_j2k->m_cp).th == 1)) && ((p_j2k->m_cp).tx0 == 0)) &&
      (((p_j2k->m_cp).ty0 == 0 && (poVar8 = p_j2k->m_output_image, poVar8->x0 == 0)))) &&
     ((poVar8->y0 == 0 && ((poVar8->x1 == (p_j2k->m_cp).tdx && (poVar8->y1 == (p_j2k->m_cp).tdy)))))
     ) {
    OVar7 = 0;
    OVar5 = opj_j2k_read_tile_header
                      (p_j2k,&l_current_tile_no,(OPJ_UINT32 *)0x0,&l_tile_x0,&l_tile_y0,&l_tile_x1,
                       &l_tile_y1,&l_nb_comps,&l_go_on,p_stream,p_manager);
    if (OVar5 != 0) {
      OVar7 = 0;
      OVar5 = opj_j2k_decode_tile(p_j2k,l_current_tile_no,(OPJ_BYTE *)0x0,0,local_50,p_manager);
      if (OVar5 == 0) {
        opj_event_msg(p_manager,1,"Failed to decode tile 1/1\n");
      }
      else {
        poVar8 = p_j2k->m_output_image;
        lVar13 = 0x30;
        lVar15 = 0;
        OVar7 = 1;
        for (uVar12 = 0; uVar12 < poVar8->numcomps; uVar12 = uVar12 + 1) {
          opj_image_data_free(*(void **)((long)&poVar8->comps->data + lVar15));
          poVar8 = p_j2k->m_output_image;
          poVar1 = p_j2k->m_tcd;
          poVar2 = poVar1->tcd_image->tiles->comps;
          poVar3 = poVar8->comps;
          *(undefined8 *)((long)&poVar3->data + lVar15) =
               *(undefined8 *)((long)&poVar2->x0 + lVar13);
          *(undefined4 *)((long)&poVar3->resno_decoded + lVar15) =
               *(undefined4 *)((long)&poVar1->image->comps->resno_decoded + lVar15);
          *(undefined8 *)((long)&poVar2->x0 + lVar13) = 0;
          lVar15 = lVar15 + 0x40;
          lVar13 = lVar13 + 0x70;
        }
      }
    }
  }
  else {
    iVar14 = 0;
    do {
      if (((OVar6 == 1) && ((p_j2k->m_cp).th == 1)) &&
         (((p_j2k->m_cp).tcps)->m_data != (OPJ_BYTE *)0x0)) {
        l_current_tile_no = 0;
        p_j2k->m_current_tile_number = 0;
        *(byte *)&p_j2k->m_specific_param = *(byte *)&p_j2k->m_specific_param | 0x80;
        uVar12 = 0;
      }
      else {
        OVar7 = opj_j2k_read_tile_header
                          (p_j2k,&l_current_tile_no,(OPJ_UINT32 *)0x0,&l_tile_x0,&l_tile_y0,
                           &l_tile_x1,&l_tile_y1,&l_nb_comps,&l_go_on,local_50,p_manager);
        if (OVar7 == 0) {
          return 0;
        }
        if (l_go_on == 0) break;
        uVar12 = (ulong)l_current_tile_no;
      }
      OVar7 = opj_j2k_decode_tile(p_j2k,(OPJ_UINT32)uVar12,(OPJ_BYTE *)0x0,0,local_50,p_manager);
      uVar11 = (OPJ_UINT32)uVar12 + 1;
      uVar10 = (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th);
      if (OVar7 == 0) {
        opj_event_msg(p_manager,1,"Failed to decode tile %d/%d\n",(ulong)uVar11,uVar10);
        return 0;
      }
      opj_event_msg(p_manager,4,"Tile %d/%d has been decoded.\n",(ulong)uVar11,uVar10);
      OVar7 = opj_j2k_update_image_data(p_j2k->m_tcd,p_j2k->m_output_image);
      if (OVar7 == 0) {
        return 0;
      }
      if (((p_j2k->m_cp).tw == 1) && ((p_j2k->m_cp).th == 1)) {
        poVar8 = p_j2k->m_private_image;
        poVar4 = p_j2k->m_output_image;
        if (((poVar4->x0 == poVar8->x0) &&
            ((poVar4->y0 == poVar8->y0 && (poVar4->x1 == poVar8->x1)))) &&
           (poVar4->y1 == poVar8->y1)) goto LAB_001178ca;
      }
      else {
LAB_001178ca:
        opj_j2k_tcp_data_destroy((p_j2k->m_cp).tcps + uVar12);
      }
      opj_event_msg(p_manager,4,"Image data has been updated with tile %d.\n\n",(ulong)uVar11);
      OVar9 = opj_stream_get_number_byte_left(local_50);
      if ((OVar9 == 0) && ((p_j2k->m_specific_param).m_decoder.m_state == 0x40)) break;
      iVar14 = iVar14 + 1;
      OVar6 = (p_j2k->m_cp).tw;
    } while (iVar14 != (p_j2k->m_cp).th * OVar6);
    OVar7 = 1;
  }
  return OVar7;
}

Assistant:

static OPJ_BOOL opj_j2k_decode_tiles(opj_j2k_t *p_j2k,
                                     opj_stream_private_t *p_stream,
                                     opj_event_mgr_t * p_manager)
{
    OPJ_BOOL l_go_on = OPJ_TRUE;
    OPJ_UINT32 l_current_tile_no;
    OPJ_INT32 l_tile_x0, l_tile_y0, l_tile_x1, l_tile_y1;
    OPJ_UINT32 l_nb_comps;
    OPJ_UINT32 nr_tiles = 0;

    /* Particular case for whole single tile decoding */
    /* We can avoid allocating intermediate tile buffers */
    if (p_j2k->m_cp.tw == 1 && p_j2k->m_cp.th == 1 &&
            p_j2k->m_cp.tx0 == 0 && p_j2k->m_cp.ty0 == 0 &&
            p_j2k->m_output_image->x0 == 0 &&
            p_j2k->m_output_image->y0 == 0 &&
            p_j2k->m_output_image->x1 == p_j2k->m_cp.tdx &&
            p_j2k->m_output_image->y1 == p_j2k->m_cp.tdy) {
        OPJ_UINT32 i;
        if (! opj_j2k_read_tile_header(p_j2k,
                                       &l_current_tile_no,
                                       NULL,
                                       &l_tile_x0, &l_tile_y0,
                                       &l_tile_x1, &l_tile_y1,
                                       &l_nb_comps,
                                       &l_go_on,
                                       p_stream,
                                       p_manager)) {
            return OPJ_FALSE;
        }

        if (! opj_j2k_decode_tile(p_j2k, l_current_tile_no, NULL, 0,
                                  p_stream, p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR, "Failed to decode tile 1/1\n");
            return OPJ_FALSE;
        }

        /* Transfer TCD data to output image data */
        for (i = 0; i < p_j2k->m_output_image->numcomps; i++) {
            opj_image_data_free(p_j2k->m_output_image->comps[i].data);
            p_j2k->m_output_image->comps[i].data =
                p_j2k->m_tcd->tcd_image->tiles->comps[i].data;
            p_j2k->m_output_image->comps[i].resno_decoded =
                p_j2k->m_tcd->image->comps[i].resno_decoded;
            p_j2k->m_tcd->tcd_image->tiles->comps[i].data = NULL;
        }

        return OPJ_TRUE;
    }

    for (;;) {
        if (p_j2k->m_cp.tw == 1 && p_j2k->m_cp.th == 1 &&
                p_j2k->m_cp.tcps[0].m_data != NULL) {
            l_current_tile_no = 0;
            p_j2k->m_current_tile_number = 0;
            p_j2k->m_specific_param.m_decoder.m_state |= J2K_STATE_DATA;
        } else {
            if (! opj_j2k_read_tile_header(p_j2k,
                                           &l_current_tile_no,
                                           NULL,
                                           &l_tile_x0, &l_tile_y0,
                                           &l_tile_x1, &l_tile_y1,
                                           &l_nb_comps,
                                           &l_go_on,
                                           p_stream,
                                           p_manager)) {
                return OPJ_FALSE;
            }

            if (! l_go_on) {
                break;
            }
        }

        if (! opj_j2k_decode_tile(p_j2k, l_current_tile_no, NULL, 0,
                                  p_stream, p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR, "Failed to decode tile %d/%d\n",
                          l_current_tile_no + 1, p_j2k->m_cp.th * p_j2k->m_cp.tw);
            return OPJ_FALSE;
        }

        opj_event_msg(p_manager, EVT_INFO, "Tile %d/%d has been decoded.\n",
                      l_current_tile_no + 1, p_j2k->m_cp.th * p_j2k->m_cp.tw);

        if (! opj_j2k_update_image_data(p_j2k->m_tcd,
                                        p_j2k->m_output_image)) {
            return OPJ_FALSE;
        }

        if (p_j2k->m_cp.tw == 1 && p_j2k->m_cp.th == 1 &&
                !(p_j2k->m_output_image->x0 == p_j2k->m_private_image->x0 &&
                  p_j2k->m_output_image->y0 == p_j2k->m_private_image->y0 &&
                  p_j2k->m_output_image->x1 == p_j2k->m_private_image->x1 &&
                  p_j2k->m_output_image->y1 == p_j2k->m_private_image->y1)) {
            /* Keep current tcp data */
        } else {
            opj_j2k_tcp_data_destroy(&p_j2k->m_cp.tcps[l_current_tile_no]);
        }

        opj_event_msg(p_manager, EVT_INFO,
                      "Image data has been updated with tile %d.\n\n", l_current_tile_no + 1);

        if (opj_stream_get_number_byte_left(p_stream) == 0
                && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC) {
            break;
        }
        if (++nr_tiles ==  p_j2k->m_cp.th * p_j2k->m_cp.tw) {
            break;
        }
    }

    return OPJ_TRUE;
}